

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_findFrameCompressedSize(void *src,size_t srcSize)

{
  size_t sVar1;
  ulong uVar2;
  char cVar3;
  BYTE *ipstart;
  void *src_00;
  ulong srcSize_00;
  size_t sVar4;
  blockProperties_t blockProperties;
  ZSTD_frameHeader zfh;
  blockProperties_t local_5c;
  ZSTD_frameHeader local_50;
  
  if ((srcSize < 8) || ((*src & 0xfffffff0) != 0x184d2a50)) {
    sVar1 = ZSTD_getFrameHeader_advanced(&local_50,src,srcSize,ZSTD_f_zstd1);
    sVar4 = 0xffffffffffffffb8;
    if (0xffffffffffffff88 < sVar1) {
      sVar4 = sVar1;
    }
    if (sVar1 == 0) {
      src_00 = (void *)((long)src + (ulong)local_50.headerSize);
      srcSize_00 = srcSize - local_50.headerSize;
      sVar1 = sVar4;
      do {
        sVar4 = ZSTD_getcBlockSize(src_00,srcSize_00,&local_5c);
        cVar3 = '\x01';
        if (sVar4 < 0xffffffffffffff89) {
          uVar2 = sVar4 + 3;
          if (srcSize_00 < uVar2) {
            sVar4 = 0xffffffffffffffb8;
          }
          else {
            src_00 = (void *)((long)src_00 + uVar2);
            cVar3 = (local_5c.lastBlock != 0) * '\x03';
            srcSize_00 = srcSize_00 - uVar2;
            sVar4 = sVar1;
          }
        }
        sVar1 = sVar4;
      } while (cVar3 == '\0');
      if (cVar3 == '\x03') {
        if (local_50.checksumFlag != 0) {
          if (srcSize_00 < 4) {
            return 0xffffffffffffffb8;
          }
          src_00 = (void *)((long)src_00 + 4);
        }
        sVar4 = (long)src_00 - (long)src;
      }
    }
  }
  else {
    sVar4 = 0xfffffffffffffff2;
    if (*(uint *)((long)src + 4) >> 3 < 0x1fffffff) {
      sVar4 = (ulong)*(uint *)((long)src + 4) + 8;
    }
  }
  return sVar4;
}

Assistant:

size_t ZSTD_findFrameCompressedSize(const void *src, size_t srcSize)
{
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
    if (ZSTD_isLegacy(src, srcSize))
        return ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
#endif
    if ( (srcSize >= ZSTD_SKIPPABLEHEADERSIZE)
      && (MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START ) {
        return readSkippableFrameSize(src, srcSize);
    } else {
        const BYTE* ip = (const BYTE*)src;
        const BYTE* const ipstart = ip;
        size_t remainingSize = srcSize;
        ZSTD_frameHeader zfh;

        /* Extract Frame Header */
        {   size_t const ret = ZSTD_getFrameHeader(&zfh, src, srcSize);
            if (ZSTD_isError(ret)) return ret;
            if (ret > 0) return ERROR(srcSize_wrong);
        }

        ip += zfh.headerSize;
        remainingSize -= zfh.headerSize;

        /* Loop on each block */
        while (1) {
            blockProperties_t blockProperties;
            size_t const cBlockSize = ZSTD_getcBlockSize(ip, remainingSize, &blockProperties);
            if (ZSTD_isError(cBlockSize)) return cBlockSize;

            if (ZSTD_blockHeaderSize + cBlockSize > remainingSize)
                return ERROR(srcSize_wrong);

            ip += ZSTD_blockHeaderSize + cBlockSize;
            remainingSize -= ZSTD_blockHeaderSize + cBlockSize;

            if (blockProperties.lastBlock) break;
        }

        if (zfh.checksumFlag) {   /* Final frame content checksum */
            if (remainingSize < 4) return ERROR(srcSize_wrong);
            ip += 4;
        }

        return ip - ipstart;
    }
}